

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::GLES2ThreadedSharingTest::addProgramOperations(GLES2ThreadedSharingTest *this)

{
  deInt32 *pdVar1;
  EGLThread *pEVar2;
  SharedPtrStateBase *pSVar3;
  pointer ppEVar4;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> *pSVar5;
  CreateShader *pCVar6;
  ShaderSource *pSVar7;
  ShaderCompile *pSVar8;
  CreateProgram *this_00;
  AttachShader *pAVar9;
  LinkProgram *pLVar10;
  DetachShader *pDVar11;
  DeleteProgram *pDVar12;
  DeleteShader *pDVar13;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> program;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> fragmentShader;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> vertexShader;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_1b8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_1a8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_198;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_180;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_170;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_160;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_150;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_140;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_130;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_120;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_110;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_100;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_f0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_e0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_d0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_c0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_b0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_a0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_90;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_80;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_70;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_60;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_50;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_40;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_30;
  
  local_198.m_ptr = (Shader *)0x0;
  local_198.m_state = (SharedPtrStateBase *)0x0;
  local_1a8.m_ptr = (Shader *)0x0;
  local_1a8.m_state = (SharedPtrStateBase *)0x0;
  if ((this->m_config).define != 0) {
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar6 = (CreateShader *)operator_new(0x80);
    GLES2ThreadTest::CreateShader::CreateShader
              (pCVar6,0x8b31,&local_198,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pCVar6);
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar7 = (ShaderSource *)operator_new(0x98);
    local_b0.m_ptr = local_198.m_ptr;
    local_b0.m_state = local_198.m_state;
    if (local_198.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_198.m_state)->strongRefCount = (local_198.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_198.m_state)->weakRefCount = (local_198.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderSource::ShaderSource
              (pSVar7,&local_b0,
               "attribute highp vec2 a_pos;\nvarying mediump vec2 v_pos;\nvoid main(void)\n{\n\tv_pos = a_pos;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}\n"
               ,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pSVar7);
    if (local_b0.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_b0.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_b0.m_ptr = (Shader *)0x0;
        (*(local_b0.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_b0.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_b0.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_b0.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_b0.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar8 = (ShaderCompile *)operator_new(0x78);
    local_c0.m_ptr = local_198.m_ptr;
    local_c0.m_state = local_198.m_state;
    if (local_198.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_198.m_state)->strongRefCount = (local_198.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_198.m_state)->weakRefCount = (local_198.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderCompile::ShaderCompile
              (pSVar8,&local_c0,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pSVar8);
    if (local_c0.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_c0.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_c0.m_ptr = (Shader *)0x0;
        (*(local_c0.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_c0.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_c0.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_c0.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_c0.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar6 = (CreateShader *)operator_new(0x80);
    GLES2ThreadTest::CreateShader::CreateShader
              (pCVar6,0x8b30,&local_1a8,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pCVar6);
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar7 = (ShaderSource *)operator_new(0x98);
    local_d0.m_ptr = local_1a8.m_ptr;
    local_d0.m_state = local_1a8.m_state;
    if (local_1a8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_1a8.m_state)->strongRefCount = (local_1a8.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_1a8.m_state)->weakRefCount = (local_1a8.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderSource::ShaderSource
              (pSVar7,&local_d0,
               "varying mediump vec2 v_pos;\nvoid main(void)\n{\n\tgl_FragColor = vec4(v_pos, 0.5, 1.0);\n}\n"
               ,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pSVar7);
    if (local_d0.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_d0.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_d0.m_ptr = (Shader *)0x0;
        (*(local_d0.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_d0.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_d0.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_d0.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_d0.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar8 = (ShaderCompile *)operator_new(0x78);
    local_e0.m_ptr = local_1a8.m_ptr;
    local_e0.m_state = local_1a8.m_state;
    if (local_1a8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_1a8.m_state)->strongRefCount = (local_1a8.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_1a8.m_state)->weakRefCount = (local_1a8.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderCompile::ShaderCompile
              (pSVar8,&local_e0,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pSVar8);
    if (local_e0.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_e0.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_e0.m_ptr = (Shader *)0x0;
        (*(local_e0.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_e0.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_e0.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_e0.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_e0.m_state = (SharedPtrStateBase *)0x0;
      }
    }
  }
  local_1b8.m_ptr = (Program *)0x0;
  local_1b8.m_state = (SharedPtrStateBase *)0x0;
  pEVar2 = *(this->m_threads).
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  this_00 = (CreateProgram *)operator_new(0x78);
  GLES2ThreadTest::CreateProgram::CreateProgram
            (this_00,&local_1b8,(this->m_config).useFenceSync,(this->m_config).serverSync);
  tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)this_00);
  if ((this->m_config).define != 0) {
    if (((this->m_config).modify == 0) && ((this->m_config).render != true)) {
      pEVar2 = (this->m_threads).
               super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
               ._M_impl.super__Vector_impl_data._M_start[1];
      pAVar9 = (AttachShader *)operator_new(0x88);
      local_120.m_ptr = local_1b8.m_ptr;
      local_120.m_state = local_1b8.m_state;
      if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_1b8.m_state)->strongRefCount = (local_1b8.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_1b8.m_state)->weakRefCount = (local_1b8.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      local_130.m_ptr = local_198.m_ptr;
      local_130.m_state = local_198.m_state;
      if (local_198.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_198.m_state)->strongRefCount = (local_198.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_198.m_state)->weakRefCount = (local_198.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::AttachShader::AttachShader
                (pAVar9,&local_120,&local_130,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pAVar9);
      if (local_130.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_130.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_130.m_ptr = (Shader *)0x0;
          (*(local_130.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_130.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_130.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_130.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_130.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      if (local_120.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_120.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_120.m_ptr = (Program *)0x0;
          (*(local_120.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_120.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_120.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_120.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_120.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pEVar2 = (this->m_threads).
               super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
               ._M_impl.super__Vector_impl_data._M_start[1];
      pAVar9 = (AttachShader *)operator_new(0x88);
      local_40.m_ptr = local_1b8.m_ptr;
      local_40.m_state = local_1b8.m_state;
      if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_1b8.m_state)->strongRefCount = (local_1b8.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_1b8.m_state)->weakRefCount = (local_1b8.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      local_140.m_ptr = local_1a8.m_ptr;
      local_140.m_state = local_1a8.m_state;
      if (local_1a8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_1a8.m_state)->strongRefCount = (local_1a8.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_1a8.m_state)->weakRefCount = (local_1a8.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::AttachShader::AttachShader
                (pAVar9,&local_40,&local_140,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pAVar9);
      if (local_140.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_140.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_140.m_ptr = (Shader *)0x0;
          (*(local_140.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_140.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_140.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_140.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_140.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      if (local_40.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_40.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_40.m_ptr = (Program *)0x0;
          (*(local_40.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_40.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_40;
LAB_001d9010:
          pSVar3 = pSVar5->m_state;
          if (pSVar3 != (SharedPtrStateBase *)0x0) {
            (*pSVar3->_vptr_SharedPtrStateBase[1])();
          }
          pSVar5->m_state = (SharedPtrStateBase *)0x0;
        }
      }
    }
    else {
      pEVar2 = *(this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pAVar9 = (AttachShader *)operator_new(0x88);
      local_f0.m_ptr = local_1b8.m_ptr;
      local_f0.m_state = local_1b8.m_state;
      if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_1b8.m_state)->strongRefCount = (local_1b8.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_1b8.m_state)->weakRefCount = (local_1b8.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      local_100.m_ptr = local_198.m_ptr;
      local_100.m_state = local_198.m_state;
      if (local_198.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_198.m_state)->strongRefCount = (local_198.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_198.m_state)->weakRefCount = (local_198.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::AttachShader::AttachShader
                (pAVar9,&local_f0,&local_100,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pAVar9);
      if (local_100.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_100.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_100.m_ptr = (Shader *)0x0;
          (*(local_100.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_100.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_100.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_100.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_100.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      if (local_f0.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_f0.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_f0.m_ptr = (Program *)0x0;
          (*(local_f0.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_f0.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_f0.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_f0.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_f0.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pEVar2 = *(this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pAVar9 = (AttachShader *)operator_new(0x88);
      local_30.m_ptr = local_1b8.m_ptr;
      local_30.m_state = local_1b8.m_state;
      if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_1b8.m_state)->strongRefCount = (local_1b8.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_1b8.m_state)->weakRefCount = (local_1b8.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      local_110.m_ptr = local_1a8.m_ptr;
      local_110.m_state = local_1a8.m_state;
      if (local_1a8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_1a8.m_state)->strongRefCount = (local_1a8.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_1a8.m_state)->weakRefCount = (local_1a8.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::AttachShader::AttachShader
                (pAVar9,&local_30,&local_110,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pAVar9);
      if (local_110.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_110.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_110.m_ptr = (Shader *)0x0;
          (*(local_110.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_110.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_110.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_110.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_110.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      if (local_30.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_30.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_30.m_ptr = (Program *)0x0;
          (*(local_30.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_30.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_30;
          goto LAB_001d9010;
        }
      }
    }
  }
  if ((this->m_config).modify == 1) {
    ppEVar4 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_config).render == true) {
      pEVar2 = *ppEVar4;
      pLVar10 = (LinkProgram *)operator_new(0x78);
      local_50.m_ptr = local_1b8.m_ptr;
      local_50.m_state = local_1b8.m_state;
      if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_1b8.m_state)->strongRefCount = (local_1b8.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_1b8.m_state)->weakRefCount = (local_1b8.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::LinkProgram::LinkProgram
                (pLVar10,&local_50,(this->m_config).useFenceSync,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pLVar10);
      if (local_50.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_50.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_50.m_ptr = (Program *)0x0;
          (*(local_50.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_50.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_50;
LAB_001d91b2:
          pSVar3 = pSVar5->m_state;
          if (pSVar3 != (SharedPtrStateBase *)0x0) {
            (*pSVar3->_vptr_SharedPtrStateBase[1])();
          }
          pSVar5->m_state = (SharedPtrStateBase *)0x0;
        }
      }
    }
    else {
      pEVar2 = ppEVar4[1];
      pLVar10 = (LinkProgram *)operator_new(0x78);
      local_60.m_ptr = local_1b8.m_ptr;
      local_60.m_state = local_1b8.m_state;
      if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_1b8.m_state)->strongRefCount = (local_1b8.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_1b8.m_state)->weakRefCount = (local_1b8.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::LinkProgram::LinkProgram
                (pLVar10,&local_60,(this->m_config).useFenceSync,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pLVar10);
      if (local_60.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_60.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_60.m_ptr = (Program *)0x0;
          (*(local_60.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_60.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_60;
          goto LAB_001d91b2;
        }
      }
    }
  }
  if ((this->m_config).modify == 2) {
    ppEVar4 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_config).render == true) {
      pEVar2 = *ppEVar4;
      pDVar11 = (DetachShader *)operator_new(0x80);
      local_150.m_ptr = local_1b8.m_ptr;
      local_150.m_state = local_1b8.m_state;
      if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_1b8.m_state)->strongRefCount = (local_1b8.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_1b8.m_state)->weakRefCount = (local_1b8.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::DetachShader::DetachShader
                (pDVar11,&local_150,0x8b31,(this->m_config).useFenceSync,(this->m_config).serverSync
                );
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar11);
      if (local_150.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_150.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_150.m_ptr = (Program *)0x0;
          (*(local_150.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_150.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_150.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_150.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_150.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pEVar2 = *(this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pDVar11 = (DetachShader *)operator_new(0x80);
      local_70.m_ptr = local_1b8.m_ptr;
      local_70.m_state = local_1b8.m_state;
      if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_1b8.m_state)->strongRefCount = (local_1b8.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_1b8.m_state)->weakRefCount = (local_1b8.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::DetachShader::DetachShader
                (pDVar11,&local_70,0x8b30,(this->m_config).useFenceSync,(this->m_config).serverSync)
      ;
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar11);
      if (local_70.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_70.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_70.m_ptr = (Program *)0x0;
          (*(local_70.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_70.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_70;
LAB_001d94cb:
          pSVar3 = pSVar5->m_state;
          if (pSVar3 != (SharedPtrStateBase *)0x0) {
            (*pSVar3->_vptr_SharedPtrStateBase[1])();
          }
          pSVar5->m_state = (SharedPtrStateBase *)0x0;
        }
      }
    }
    else {
      pEVar2 = ppEVar4[1];
      pDVar11 = (DetachShader *)operator_new(0x80);
      local_160.m_ptr = local_1b8.m_ptr;
      local_160.m_state = local_1b8.m_state;
      if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_1b8.m_state)->strongRefCount = (local_1b8.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_1b8.m_state)->weakRefCount = (local_1b8.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::DetachShader::DetachShader
                (pDVar11,&local_160,0x8b31,(this->m_config).useFenceSync,(this->m_config).serverSync
                );
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar11);
      if (local_160.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_160.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_160.m_ptr = (Program *)0x0;
          (*(local_160.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_160.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_160.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_160.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_160.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pEVar2 = (this->m_threads).
               super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
               ._M_impl.super__Vector_impl_data._M_start[1];
      pDVar11 = (DetachShader *)operator_new(0x80);
      local_80.m_ptr = local_1b8.m_ptr;
      local_80.m_state = local_1b8.m_state;
      if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_1b8.m_state)->strongRefCount = (local_1b8.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (local_1b8.m_state)->weakRefCount = (local_1b8.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      GLES2ThreadTest::DetachShader::DetachShader
                (pDVar11,&local_80,0x8b30,(this->m_config).useFenceSync,(this->m_config).serverSync)
      ;
      tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar11);
      if (local_80.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_80.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_80.m_ptr = (Program *)0x0;
          (*(local_80.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_80.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar5 = &local_80;
          goto LAB_001d94cb;
        }
      }
    }
  }
  if (((this->m_config).modify == 0) && ((this->m_config).render != true)) {
    pEVar2 = (this->m_threads).
             super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
             ._M_impl.super__Vector_impl_data._M_start[1];
    pDVar12 = (DeleteProgram *)operator_new(0x78);
    local_a0.m_ptr = local_1b8.m_ptr;
    local_a0.m_state = local_1b8.m_state;
    if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_1b8.m_state)->strongRefCount = (local_1b8.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_1b8.m_state)->weakRefCount = (local_1b8.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteProgram::DeleteProgram
              (pDVar12,&local_a0,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar12);
    if (local_a0.m_state == (SharedPtrStateBase *)0x0) goto LAB_001d95c1;
    LOCK();
    pdVar1 = &(local_a0.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_a0.m_ptr = (Program *)0x0;
      (*(local_a0.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_a0.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 != 0) goto LAB_001d95c1;
    pSVar5 = &local_a0;
  }
  else {
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar12 = (DeleteProgram *)operator_new(0x78);
    local_90.m_ptr = local_1b8.m_ptr;
    local_90.m_state = local_1b8.m_state;
    if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_1b8.m_state)->strongRefCount = (local_1b8.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_1b8.m_state)->weakRefCount = (local_1b8.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteProgram::DeleteProgram
              (pDVar12,&local_90,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar12);
    if (local_90.m_state == (SharedPtrStateBase *)0x0) goto LAB_001d95c1;
    LOCK();
    pdVar1 = &(local_90.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_90.m_ptr = (Program *)0x0;
      (*(local_90.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_90.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 != 0) goto LAB_001d95c1;
    pSVar5 = &local_90;
  }
  pSVar3 = pSVar5->m_state;
  if (pSVar3 != (SharedPtrStateBase *)0x0) {
    (*pSVar3->_vptr_SharedPtrStateBase[1])();
  }
  pSVar5->m_state = (SharedPtrStateBase *)0x0;
LAB_001d95c1:
  if ((this->m_config).render == true) {
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar13 = (DeleteShader *)operator_new(0x78);
    local_170.m_ptr = local_198.m_ptr;
    local_170.m_state = local_198.m_state;
    if (local_198.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_198.m_state)->strongRefCount = (local_198.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_198.m_state)->weakRefCount = (local_198.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteShader::DeleteShader
              (pDVar13,&local_170,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar13);
    if (local_170.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_170.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_170.m_ptr = (Shader *)0x0;
        (*(local_170.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_170.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_170.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_170.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_170.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pEVar2 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar13 = (DeleteShader *)operator_new(0x78);
    local_180.m_ptr = local_1a8.m_ptr;
    local_180.m_state = local_1a8.m_state;
    if (local_1a8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_1a8.m_state)->strongRefCount = (local_1a8.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_1a8.m_state)->weakRefCount = (local_1a8.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteShader::DeleteShader
              (pDVar13,&local_180,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar2->super_Thread,(Operation *)pDVar13);
    if (local_180.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_180.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_180.m_ptr = (Shader *)0x0;
        (*(local_180.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_180.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_180.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_180.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_180.m_state = (SharedPtrStateBase *)0x0;
      }
    }
  }
  if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_1b8.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_1b8.m_ptr = (Program *)0x0;
      (*(local_1b8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_1b8.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_1b8.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_1b8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_1b8.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_1a8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_1a8.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_1a8.m_ptr = (Shader *)0x0;
      (*(local_1a8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_1a8.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_1a8.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_1a8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_1a8.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_198.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_198.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_198.m_ptr = (Shader *)0x0;
      (*(local_198.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_198.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_198.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_198.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

void GLES2ThreadedSharingTest::addProgramOperations (void)
{
	// Add operations for verify
	SharedPtr<GLES2ThreadTest::Shader>	vertexShader;
	SharedPtr<GLES2ThreadTest::Shader>	fragmentShader;

	if (m_config.define)
	{
		const char* vertexShaderSource =
		"attribute highp vec2 a_pos;\n"
		"varying mediump vec2 v_pos;\n"
		"void main(void)\n"
		"{\n"
		"\tv_pos = a_pos;\n"
		"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
		"}\n";

		const char* fragmentShaderSource =
		"varying mediump vec2 v_pos;\n"
		"void main(void)\n"
		"{\n"
		"\tgl_FragColor = vec4(v_pos, 0.5, 1.0);\n"
		"}\n";

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateShader(GL_VERTEX_SHADER, vertexShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderSource(vertexShader, vertexShaderSource, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderCompile(vertexShader, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateShader(GL_FRAGMENT_SHADER, fragmentShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderSource(fragmentShader, fragmentShaderSource, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderCompile(fragmentShader, m_config.useFenceSync, m_config.serverSync));
	}

	SharedPtr<GLES2ThreadTest::Program> program;

	m_threads[0]->addOperation(new GLES2ThreadTest::CreateProgram(program, m_config.useFenceSync, m_config.serverSync));

	if (m_config.define)
	{
		// Attach shaders
		if (m_config.modify || m_config.render)
		{
			m_threads[0]->addOperation(new GLES2ThreadTest::AttachShader(program, vertexShader, m_config.useFenceSync, m_config.serverSync));
			m_threads[0]->addOperation(new GLES2ThreadTest::AttachShader(program, fragmentShader, m_config.useFenceSync, m_config.serverSync));
		}
		else
		{
			m_threads[1]->addOperation(new GLES2ThreadTest::AttachShader(program, vertexShader, m_config.useFenceSync, m_config.serverSync));
			m_threads[1]->addOperation(new GLES2ThreadTest::AttachShader(program, fragmentShader, m_config.useFenceSync, m_config.serverSync));
		}
	}

	if (m_config.modify == 1)
	{
		// Link program
		if (m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::LinkProgram(program, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::LinkProgram(program, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.modify == 2)
	{
		// Link program
		if (m_config.render)
		{
			m_threads[0]->addOperation(new GLES2ThreadTest::DetachShader(program, GL_VERTEX_SHADER, m_config.useFenceSync, m_config.serverSync));
			m_threads[0]->addOperation(new GLES2ThreadTest::DetachShader(program, GL_FRAGMENT_SHADER, m_config.useFenceSync, m_config.serverSync));
		}
		else
		{
			m_threads[1]->addOperation(new GLES2ThreadTest::DetachShader(program, GL_VERTEX_SHADER, m_config.useFenceSync, m_config.serverSync));
			m_threads[1]->addOperation(new GLES2ThreadTest::DetachShader(program, GL_FRAGMENT_SHADER, m_config.useFenceSync, m_config.serverSync));
		}
	}

	if (m_config.render)
	{
		DE_ASSERT(false);
	}

	if (m_config.modify || m_config.render)
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteProgram(program, m_config.useFenceSync, m_config.serverSync));
	else
		m_threads[1]->addOperation(new GLES2ThreadTest::DeleteProgram(program, m_config.useFenceSync, m_config.serverSync));

	if (m_config.render)
	{
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteShader(vertexShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteShader(fragmentShader, m_config.useFenceSync, m_config.serverSync));
	}
}